

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_graph.cpp
# Opt level: O1

void handlegraph::algorithms::copy_path
               (PathHandleGraph *from,path_handle_t *from_path,MutablePathHandleGraph *into,
               path_handle_t *into_path)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  handle_t handle;
  iterator __begin2;
  iterator __end2;
  undefined8 local_98;
  undefined8 local_90;
  char local_88 [8];
  iterator local_80;
  iterator local_60;
  PathForEachSocket local_40;
  
  local_40 = PathHandleGraph::scan_path(from,from_path);
  PathForEachSocket::begin(&local_80,&local_40);
  PathForEachSocket::end(&local_60,&local_40);
  while( true ) {
    bVar2 = PathForEachSocket::iterator::operator!=(&local_80,&local_60);
    if (!bVar2) break;
    local_88 = (char  [8])PathForEachSocket::iterator::operator*(&local_80);
    lVar1 = *(long *)(*(long *)into + -0xb0);
    local_98 = (**(code **)(*(long *)(&from->field_0x0 + *(long *)(*(long *)from + -0xb0)) + 0x20))
                         (&from->field_0x0 + *(long *)(*(long *)from + -0xb0),local_88);
    uVar3 = (**(code **)(*(long *)(&from->field_0x0 + *(long *)(*(long *)from + -0xb0)) + 0x28))
                      (&from->field_0x0 + *(long *)(*(long *)from + -0xb0),local_88);
    local_90 = (**(code **)(*(long *)(&into->field_0x0 + lVar1) + 0x18))
                         (&into->field_0x0 + lVar1,&local_98,uVar3);
    (**(code **)(*(long *)into + 0x168))(into,into_path,&local_90);
    PathForEachSocket::iterator::operator++(&local_80);
  }
  return;
}

Assistant:

void copy_path(const PathHandleGraph* from, const path_handle_t& from_path,
               MutablePathHandleGraph* into, const path_handle_t& into_path) {
    
    // copy steps
    for (handle_t handle : from->scan_path(from_path)) {
        into->append_step(into_path, into->get_handle(from->get_id(handle), from->get_is_reverse(handle)));
    }
}